

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_os_free_environ(uv_env_item_t *envitems,int count)

{
  int local_18;
  int i;
  int count_local;
  uv_env_item_t *envitems_local;
  
  for (local_18 = 0; local_18 < count; local_18 = local_18 + 1) {
    uv__free(envitems[local_18].name);
  }
  uv__free(envitems);
  return;
}

Assistant:

void uv_os_free_environ(uv_env_item_t* envitems, int count) {
  int i;

  for (i = 0; i < count; i++) {
    uv__free(envitems[i].name);
  }

  uv__free(envitems);
}